

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qevent.h
# Opt level: O3

QPoint __thiscall QMouseEvent::pos(QMouseEvent *this)

{
  bool bVar1;
  QPoint QVar2;
  double dVar3;
  undefined1 auVar4 [16];
  
  auVar4 = QEventPoint::position();
  dVar3 = (double)((ulong)auVar4._0_8_ & 0x8000000000000000 | 0x3fe0000000000000) + auVar4._0_8_;
  bVar1 = 2147483647.0 < dVar3;
  if (dVar3 <= -2147483648.0) {
    dVar3 = -2147483648.0;
  }
  QVar2.xp.m_i = (int)(double)(-(ulong)bVar1 & 0x41dfffffffc00000 | ~-(ulong)bVar1 & (ulong)dVar3);
  dVar3 = (double)((ulong)auVar4._8_8_ & 0x8000000000000000 | 0x3fe0000000000000) + auVar4._8_8_;
  bVar1 = 2147483647.0 < dVar3;
  if (dVar3 <= -2147483648.0) {
    dVar3 = -2147483648.0;
  }
  QVar2.yp.m_i = (int)(double)(-(ulong)bVar1 & 0x41dfffffffc00000 | ~-(ulong)bVar1 & (ulong)dVar3);
  return QVar2;
}

Assistant:

inline QPoint pos() const { return position().toPoint(); }